

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

ssize_t __thiscall r_code::SysObject::write(SysObject *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  Atom *pAVar2;
  uint *puVar3;
  SysView **ppSVar4;
  undefined4 in_register_00000034;
  uint32_t *puVar5;
  long local_40;
  size_t offset;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  uint32_t *data_local;
  SysObject *this_local;
  
  puVar5 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  *puVar5 = this->oid;
  sVar1 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
  puVar5[1] = (uint32_t)sVar1;
  sVar1 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
  puVar5[2] = (uint32_t)sVar1;
  sVar1 = vector<unsigned_int>::size(&this->markers);
  puVar5[3] = (uint32_t)sVar1;
  sVar1 = vector<r_code::SysView_*>::size(&this->views);
  puVar5[4] = (uint32_t)sVar1;
  j = 0;
  while( true ) {
    sVar1 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
    if (sVar1 <= j) break;
    pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,j);
    puVar5[j + 5] = pAVar2->atom;
    j = j + 1;
  }
  k = 0;
  while( true ) {
    sVar1 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
    if (sVar1 <= k) break;
    puVar3 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,k);
    puVar5[j + 5 + k] = *puVar3;
    k = k + 1;
  }
  l = 0;
  while( true ) {
    sVar1 = vector<unsigned_int>::size(&this->markers);
    if (sVar1 <= l) break;
    puVar3 = vector<unsigned_int>::operator[](&this->markers,l);
    puVar5[j + 5 + k + l] = *puVar3;
    l = l + 1;
  }
  local_40 = 0;
  offset = 0;
  while( true ) {
    sVar1 = vector<r_code::SysView_*>::size(&this->views);
    if (sVar1 <= offset) break;
    ppSVar4 = vector<r_code::SysView_*>::operator[](&this->views,offset);
    (*((*ppSVar4)->super_ImageObject)._vptr_ImageObject[2])
              (*ppSVar4,puVar5 + j + k + l + local_40 + 5);
    ppSVar4 = vector<r_code::SysView_*>::operator[](&this->views,offset);
    sVar1 = SysView::get_size(*ppSVar4);
    local_40 = sVar1 + local_40;
    offset = offset + 1;
  }
  return offset;
}

Assistant:

void SysObject::write(uint32_t *data)
{
    data[0] = oid;
    data[1] = code.size();
    data[2] = references.size();
    data[3] = markers.size();
    data[4] = views.size();
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code.size(); ++i) {
        data[5 + i] = code[i].atom;
    }

    for (j = 0; j < references.size(); ++j) {
        data[5 + i + j] = references[j];
    }

    for (k = 0; k < markers.size(); ++k) {
        data[5 + i + j + k] = markers[k];
    }

    size_t offset = 0;

    for (l = 0; l < views.size(); ++l) {
        views[l]->write(data + 5 + i + j + k + offset);
        offset += views[l]->get_size();
    }
}